

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plane.cpp
# Opt level: O0

istream * operator>>(istream *is,Plane *item)

{
  int iVar1;
  istream *piVar2;
  void *pvVar3;
  string local_68 [48];
  string local_38 [8];
  string tmpcate;
  Plane *item_local;
  istream *is_local;
  
  std::__cxx11::string::string(local_38);
  piVar2 = std::operator>>(is,(string *)item);
  piVar2 = std::operator>>(piVar2,local_38);
  pvVar3 = (void *)std::istream::operator>>(piVar2,&item->airSupremacy);
  pvVar3 = (void *)std::istream::operator>>(pvVar3,&item->torpedoAtk);
  pvVar3 = (void *)std::istream::operator>>(pvVar3,&item->bombAtk);
  std::istream::operator>>(pvVar3,&item->accuracy);
  std::__cxx11::string::string(local_68,local_38);
  iVar1 = PLANE_CATE_convert((string *)local_68);
  item->category = iVar1;
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_38);
  return is;
}

Assistant:

istream &operator>>(istream &is,Plane &item){
    string tmpcate;
    is>>item.name>>tmpcate>>item.airSupremacy>>item.torpedoAtk>>item.bombAtk>>item.accuracy;
    item.category=PLANE_CATE_convert(tmpcate);
    return is;
}